

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  undefined1 *puVar1;
  curl_slist *pcVar2;
  char *pcVar3;
  Curl_addrinfo *pCVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  Curl_addrinfo *pCVar9;
  void *pvVar10;
  Curl_dns_entry *pCVar11;
  Curl_addrinfo *in_RCX;
  Curl_addrinfo *pCVar12;
  Curl_addrinfo *pCVar13;
  Curl_addrinfo *__s;
  uint uVar14;
  bool bVar15;
  int port;
  char hostname [256];
  char entry_id [262];
  char address [64];
  undefined1 local_2b4 [4];
  Curl_addrinfo *local_2b0;
  Curl_easy *local_2a8;
  Curl_addrinfo *local_2a0;
  Curl_addrinfo *local_298;
  Curl_addrinfo *local_290;
  char local_288 [256];
  char local_188 [272];
  char local_78 [72];
  
  local_2b4 = (undefined1  [4])0x0;
  puVar1 = &(data->change).field_0x20;
  *puVar1 = *puVar1 & 0xfb;
  pcVar2 = (data->change).resolve;
  do {
    if (pcVar2 == (curl_slist *)0x0) {
      (data->change).resolve = (curl_slist *)0x0;
      return CURLE_OK;
    }
    pcVar3 = pcVar2->data;
    if (pcVar3 == (char *)0x0) {
      uVar14 = 0;
    }
    else if (*pcVar3 == '-') {
      in_RCX = (Curl_addrinfo *)local_2b4;
      iVar5 = __isoc99_sscanf(pcVar3 + 1,"%255[^:]:%d",local_288);
      if (iVar5 == 2) {
        create_hostcache_id(local_288,(int)local_2b4,local_188,(size_t)in_RCX);
        sVar6 = strlen(local_188);
        if (data->share != (Curl_share *)0x0) {
          Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
        }
        Curl_hash_delete((data->dns).hostcache,local_188,sVar6 + 1);
        if (data->share != (Curl_share *)0x0) {
          Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
        }
      }
      else {
        Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE removal entry \'%s\'!\n",pcVar2->data);
      }
      uVar14 = 0;
      if (iVar5 == 2) {
LAB_0012304e:
        uVar14 = 0;
      }
    }
    else {
      pcVar3 = pcVar2->data;
      pcVar7 = strchr(pcVar3,0x3a);
      bVar15 = true;
      if ((pcVar7 == (char *)0x0) || (0xff < (long)pcVar7 - (long)pcVar3)) {
        local_2b0 = (Curl_addrinfo *)0x0;
        pCVar12 = (Curl_addrinfo *)0x0;
      }
      else {
        memcpy(local_288,pcVar3,(long)pcVar7 - (long)pcVar3);
        in_RCX = (Curl_addrinfo *)(pcVar7 + -(long)pcVar2->data);
        local_288[(long)in_RCX] = '\0';
        uVar8 = strtoul(pcVar7 + 1,(char **)&local_2a0,10);
        if (((uVar8 < 0x10000) && (in_RCX = local_2a0, local_2a0 != (Curl_addrinfo *)(pcVar7 + 1)))
           && ((char)local_2a0->ai_flags == ':')) {
          local_2b4 = SUB84(uVar8,0);
          in_RCX = (Curl_addrinfo *)((long)&local_2a0->ai_flags + 1);
          local_290 = in_RCX;
          if ((char)local_2a0->ai_flags == '\0') {
            local_2b0 = (Curl_addrinfo *)0x0;
            pCVar9 = local_2a0;
          }
          else {
            local_2b0 = (Curl_addrinfo *)0x0;
            in_RCX = (Curl_addrinfo *)0x0;
            pCVar12 = local_2a0;
            local_2a8 = data;
            do {
              __s = (Curl_addrinfo *)((long)&pCVar12->ai_flags + 1);
              local_298 = in_RCX;
              pCVar9 = (Curl_addrinfo *)strchr((char *)__s,0x2c);
              if (pCVar9 == (Curl_addrinfo *)0x0) {
                sVar6 = strlen((char *)__s);
                pCVar9 = (Curl_addrinfo *)((long)&__s->ai_flags + sVar6);
              }
              pCVar13 = pCVar9;
              data = local_2a8;
              in_RCX = local_298;
              pCVar4 = local_2b0;
              if ((char)__s->ai_flags == '[') {
                uVar14 = 5;
                if ((pCVar9 != __s) && (*(char *)((long)&pCVar9[-1].ai_next + 7) == ']')) {
                  __s = (Curl_addrinfo *)((long)&pCVar12->ai_flags + 2);
                  pCVar13 = (Curl_addrinfo *)((long)&pCVar9[-1].ai_next + 7);
                  goto LAB_0012316a;
                }
              }
              else {
LAB_0012316a:
                uVar8 = (long)pCVar13 - (long)__s;
                if (uVar8 == 0) {
                  uVar14 = 6;
                }
                else {
                  uVar14 = 5;
                  if (uVar8 < 0x40) {
                    memcpy(local_78,__s,uVar8);
                    local_78[uVar8] = '\0';
                    in_RCX = Curl_str2addr(local_78,(int)local_2b4);
                    data = local_2a8;
                    if (in_RCX == (Curl_addrinfo *)0x0) {
                      Curl_infof(local_2a8,"Resolve address \'%s\' found illegal!\n",local_78);
                      in_RCX = local_298;
                      pCVar4 = local_2b0;
                    }
                    else {
                      uVar14 = 0;
                      pCVar4 = in_RCX;
                      if (local_298 != (Curl_addrinfo *)0x0) {
                        local_298->ai_next = in_RCX;
                        pCVar4 = local_2b0;
                      }
                    }
                  }
                }
              }
              local_2b0 = pCVar4;
              bVar15 = true;
              if ((uVar14 != 0) && (uVar14 != 6)) {
                pCVar12 = local_290;
                local_2a0 = pCVar9;
                if (uVar14 != 5) goto LAB_001233a7;
                goto LAB_00123243;
              }
              pCVar12 = pCVar9;
            } while ((char)pCVar9->ai_flags != '\0');
          }
          bVar15 = local_2b0 == (Curl_addrinfo *)0x0;
          pCVar12 = local_290;
          local_2a0 = pCVar9;
        }
        else {
          local_2b0 = (Curl_addrinfo *)0x0;
          bVar15 = true;
          pCVar12 = (Curl_addrinfo *)0x0;
        }
      }
LAB_00123243:
      if (bVar15) {
        Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'!\n",pcVar2->data);
        Curl_freeaddrinfo(local_2b0);
        uVar14 = 4;
      }
      else {
        create_hostcache_id(local_288,(int)local_2b4,local_188,(size_t)in_RCX);
        sVar6 = strlen(local_188);
        if (data->share != (Curl_share *)0x0) {
          Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
        }
        pvVar10 = Curl_hash_pick((data->dns).hostcache,local_188,sVar6 + 1);
        if (pvVar10 != (void *)0x0) {
          Curl_infof(data,"RESOLVE %s:%d is - old addresses discarded!\n",local_288,
                     (ulong)(uint)local_2b4);
          Curl_hash_delete((data->dns).hostcache,local_188,sVar6 + 1);
        }
        in_RCX = (Curl_addrinfo *)(ulong)(uint)local_2b4;
        pCVar11 = Curl_cache_addr(data,local_2b0,local_288,(int)local_2b4);
        if (pCVar11 != (Curl_dns_entry *)0x0) {
          pCVar11->timestamp = 0;
          pCVar11->inuse = pCVar11->inuse + -1;
        }
        if (data->share != (Curl_share *)0x0) {
          Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
        }
        if (pCVar11 == (Curl_dns_entry *)0x0) {
          Curl_freeaddrinfo(local_2b0);
          uVar14 = 1;
        }
        else {
          in_RCX = (Curl_addrinfo *)(ulong)(uint)local_2b4;
          uVar14 = 0;
          Curl_infof(data,"Added %s:%d:%s to DNS cache\n",local_288,in_RCX,pCVar12);
          if ((local_288[0] == '*') && (local_288[1] == '\0')) {
            in_RCX = (Curl_addrinfo *)(ulong)(uint)local_2b4;
            uVar14 = 0;
            Curl_infof(data,"RESOLVE %s:%d is wildcard, enabling wildcard checks\n",local_288);
            puVar1 = &(data->change).field_0x20;
            *puVar1 = *puVar1 | 4;
          }
        }
      }
LAB_001233a7:
      if (uVar14 == 0) goto LAB_0012304e;
    }
    if ((uVar14 & 3) != 0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar2 = pcVar2->next;
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct curl_slist *hostp;
  char hostname[256];
  int port = 0;

  /* Default is no wildcard found */
  data->change.wildcard_resolve = false;

  for(hostp = data->change.resolve; hostp; hostp = hostp->next) {
    char entry_id[MAX_HOSTCACHE_LEN];
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      size_t entry_len;

      if(2 != sscanf(hostp->data + 1, "%255[^:]:%d", hostname, &port)) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE removal entry '%s'!\n",
              hostp->data);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* delete entry, ignore if it didn't exist */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);
    }
    else {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *head = NULL, *tail = NULL;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      char *addresses = NULL;
#endif
      char *addr_begin;
      char *addr_end;
      char *port_ptr;
      char *end_ptr;
      char *host_end;
      unsigned long tmp_port;
      bool error = true;

      host_end = strchr(hostp->data, ':');
      if(!host_end ||
         ((host_end - hostp->data) >= (ptrdiff_t)sizeof(hostname)))
        goto err;

      memcpy(hostname, hostp->data, host_end - hostp->data);
      hostname[host_end - hostp->data] = '\0';

      port_ptr = host_end + 1;
      tmp_port = strtoul(port_ptr, &end_ptr, 10);
      if(tmp_port > USHRT_MAX || end_ptr == port_ptr || *end_ptr != ':')
        goto err;

      port = (int)tmp_port;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = end_ptr + 1;
#endif

      while(*end_ptr) {
        size_t alen;
        struct Curl_addrinfo *ai;

        addr_begin = end_ptr + 1;
        addr_end = strchr(addr_begin, ',');
        if(!addr_end)
          addr_end = addr_begin + strlen(addr_begin);
        end_ptr = addr_end;

        /* allow IP(v6) address within [brackets] */
        if(*addr_begin == '[') {
          if(addr_end == addr_begin || *(addr_end - 1) != ']')
            goto err;
          ++addr_begin;
          --addr_end;
        }

        alen = addr_end - addr_begin;
        if(!alen)
          continue;

        if(alen >= sizeof(address))
          goto err;

        memcpy(address, addr_begin, alen);
        address[alen] = '\0';

#ifndef ENABLE_IPV6
        if(strchr(address, ':')) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.\n",
                address);
          continue;
        }
#endif

        ai = Curl_str2addr(address, port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal!\n", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
      }

      if(!head)
        goto err;

      error = false;
   err:
      if(error) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'!\n",
              hostp->data);
        Curl_freeaddrinfo(head);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if its already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %s:%d is - old addresses discarded!\n",
                hostname, port);
        /* delete old entry entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as added by CURLOPT_RESOLVE. */

        Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
      }

      /* put this new host in the cache */
      dns = Curl_cache_addr(data, head, hostname, port);
      if(dns) {
        dns->timestamp = 0; /* mark as added by CURLOPT_RESOLVE */
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
            dns->inuse--;
      }

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
      infof(data, "Added %s:%d:%s to DNS cache\n",
            hostname, port, addresses);

      /* Wildcard hostname */
      if(hostname[0] == '*' && hostname[1] == '\0') {
        infof(data, "RESOLVE %s:%d is wildcard, enabling wildcard checks\n",
              hostname, port);
        data->change.wildcard_resolve = true;
      }
    }
  }
  data->change.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}